

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono_time_traits.hpp
# Opt level: O0

time_type asio::detail::
          chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>
          ::add(time_type *t,duration_type *d)

{
  bool bVar1;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar2;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_RDI;
  time_type epoch;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffa8;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *in_stack_ffffffffffffffb0;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  in_stack_ffffffffffffffb8;
  duration<long,_std::ratio<1L,_1000000000L>_> *in_stack_ffffffffffffffc0;
  
  std::chrono::
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(in_stack_ffffffffffffffb0);
  bVar1 = std::chrono::operator>=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  if (bVar1) {
    std::chrono::
    time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
    ::max();
    std::chrono::operator-
              ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_ffffffffffffffb8.__d.__r,in_stack_ffffffffffffffb0);
    bVar1 = std::chrono::operator<
                      (in_stack_ffffffffffffffc0,
                       (duration<long,_std::ratio<1L,_1000000000L>_> *)
                       in_stack_ffffffffffffffb8.__d.__r);
    in_RDI = in_stack_ffffffffffffffb0;
    if (bVar1) {
      tVar2 = std::chrono::
              time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              ::max();
      return (duration)tVar2.__d.__r;
    }
  }
  else {
    in_stack_ffffffffffffffb8 =
         std::chrono::
         time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
         ::min();
    std::chrono::operator-
              ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_ffffffffffffffb8.__d.__r,in_RDI);
    std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::operator-
              (&in_stack_ffffffffffffffa8->__d);
    bVar1 = std::chrono::operator>(&in_RDI->__d,&in_stack_ffffffffffffffa8->__d);
    if (bVar1) {
      tVar2 = std::chrono::
              time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              ::min();
      return (duration)tVar2.__d.__r;
    }
  }
  tVar2 = std::chrono::operator+
                    ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)in_stack_ffffffffffffffb8.__d.__r,&in_RDI->__d);
  return (duration)tVar2.__d.__r;
}

Assistant:

static time_type add(const time_type& t, const duration_type& d)
  {
    const time_type epoch;
    if (t >= epoch)
    {
      if ((time_type::max)() - t < d)
        return (time_type::max)();
    }
    else // t < epoch
    {
      if (-(t - (time_type::min)()) > d)
        return (time_type::min)();
    }

    return t + d;
  }